

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

_Bool f32_is_zon2(union_float32 a,union_float32 b)

{
  _Bool _Var1;
  undefined1 local_11;
  union_float32 b_local;
  union_float32 a_local;
  
  _Var1 = float32_is_zero_or_normal(a.s);
  local_11 = false;
  if (_Var1) {
    local_11 = float32_is_zero_or_normal(b.s);
  }
  return local_11;
}

Assistant:

static inline bool f32_is_zon2(union_float32 a, union_float32 b)
{
    if (QEMU_HARDFLOAT_2F32_USE_FP) {
        /*
         * Not using a temp variable for consecutive fpclassify calls ends up
         * generating faster code.
         */
        return (fpclassify(a.h) == FP_NORMAL || fpclassify(a.h) == FP_ZERO) &&
               (fpclassify(b.h) == FP_NORMAL || fpclassify(b.h) == FP_ZERO);
    }
    return float32_is_zero_or_normal(a.s) &&
           float32_is_zero_or_normal(b.s);
}